

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comment_grammar.cpp
# Opt level: O1

void __thiscall franca::AnnotationGrammar::AnnotationGrammar(AnnotationGrammar *this)

{
  parser_binder<boost::spirit::qi::action<boost::spirit::qi::eps_parser,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::clear>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_>_>,_2L>_>_>,_mpl_::bool_<false>_>
  f;
  type result;
  undefined1 **local_50;
  long lStack_48;
  undefined1 *local_40;
  undefined8 uStack_38;
  undefined1 *local_30;
  
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unnamed-grammar","");
  (this->
  super_grammar<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->annotation_;
  (this->
  super_grammar<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).name_._M_dataplus._M_p =
       (pointer)&(this->
                 super_grammar<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
                 ).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->
              super_grammar<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              ).name_,local_50,lStack_48 + (long)local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unnamed-rule","");
  (this->annotation_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->annotation_;
  (this->annotation_).name_._M_dataplus._M_p = (pointer)&(this->annotation_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->annotation_).name_,local_50,lStack_48 + (long)local_50);
  (this->annotation_).f.
  super_function4<bool,_const_char_*&,_const_char_*const_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  local_40 = cur_dox_abi_cxx11_;
  local_30 = cur_dox_abi_cxx11_;
  f.p.f.proto_expr_.child0.proto_expr_._0_8_ = lStack_48;
  f.p._0_8_ = local_50;
  f.p.f.proto_expr_.child0.proto_expr_.child1.proto_expr_.child0.t_ =
       (expr_type)(expr_type)cur_dox_abi_cxx11_;
  f.p.f.proto_expr_.child1.proto_expr_._0_8_ = uStack_38;
  f.p.f.proto_expr_.child1.proto_expr_.child1.proto_expr_.child0.t_ =
       (expr_type)(expr_type)cur_dox_abi_cxx11_;
  boost::
  function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(char_const*&,char_const*const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)&(this->annotation_).f,f);
  return;
}

Assistant:

AnnotationGrammar::AnnotationGrammar():
		AnnotationGrammar::base_type(annotation_)
{
	using boost::spirit::eps;
	using boost::spirit::_val;
	namespace ph = boost::phoenix;

	annotation_ = eps[_val = ph::ref(cur_dox), ph::clear(ph::ref(cur_dox))];
}